

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

int mg_node_equal(mg_node *lhs,mg_node *rhs)

{
  uint uVar1;
  uint uVar2;
  mg_string **ppmVar3;
  mg_string **ppmVar4;
  int iVar5;
  ulong uVar6;
  
  if ((lhs->id != rhs->id) || (uVar1 = lhs->label_count, uVar1 != rhs->label_count)) {
    return 0;
  }
  if ((ulong)uVar1 != 0) {
    ppmVar3 = lhs->labels;
    ppmVar4 = rhs->labels;
    uVar6 = 0;
    do {
      uVar2 = ppmVar3[uVar6]->size;
      if (uVar2 != ppmVar4[uVar6]->size) {
        return 0;
      }
      iVar5 = bcmp(ppmVar3[uVar6]->data,ppmVar4[uVar6]->data,(ulong)uVar2);
      if (iVar5 != 0) {
        return 0;
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  iVar5 = mg_map_equal(lhs->properties,rhs->properties);
  return iVar5;
}

Assistant:

int mg_node_equal(const mg_node *lhs, const mg_node *rhs) {
  if (lhs->id != rhs->id) {
    return 0;
  }
  if (lhs->label_count != rhs->label_count) {
    return 0;
  }
  for (uint32_t i = 0; i < lhs->label_count; ++i) {
    if (!mg_string_equal(lhs->labels[i], rhs->labels[i])) {
      return 0;
    }
  }
  return mg_map_equal(lhs->properties, rhs->properties);
}